

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O3

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  undefined8 *puVar1;
  iterator iVar2;
  MyDB_PageBase *this_00;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>,_bool>
  pVar4;
  MyDB_PageHandle MVar5;
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  pair<std::shared_ptr<MyDB_Table>,_long> local_58;
  pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*> local_40;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0010ecf0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 **)&(this->pageMap)._M_t._M_impl.super__Rb_tree_header._M_header = puVar1;
  *(undefined8 **)&(this->pageMap)._M_t._M_impl = puVar1 + 2;
  curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)index;
  curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(index + 8);
  if (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  curId.second = in_RCX;
  iVar2 = std::
          _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
          ::find((_Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
                  *)table,&curId);
  if (iVar2._M_node ==
      (_Base_ptr)&(table->super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>)._M_refcount) {
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    local_58.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_58.second = curId.second;
    MyDB_PageBase::MyDB_PageBase
              (this_00,(void *)0x0,false,0xffffffffffffffff,false,0,&local_58,
               (MyDB_BufferManager *)table);
    if (local_58.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_40.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_40.first.second = curId.second;
    local_40.second = this_00;
    pVar4 = std::
            _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>>
            ::
            _M_insert_unique<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>
                      ((_Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>>
                        *)table,&local_40);
    _Var3._M_pi = pVar4._8_8_;
    if (local_40.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    this_00 = (MyDB_PageBase *)iVar2._M_node[1]._M_right;
    _Var3._M_pi = extraout_RDX;
  }
  puVar1 = *(undefined8 **)&(this->pageMap)._M_t._M_impl;
  *puVar1 = this_00;
  this_00->handleCount = this_00->handleCount + 1;
  puVar1[1] = table;
  if (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage (MyDB_TablePtr table, long index) {
	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();
	// Find if this page is in the buffer
	pair<MyDB_TablePtr, long> curId(table, index);
	map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>:: iterator it_pageMap = pageMap.find(curId);

	//If find this page in buffer
	if (it_pageMap != pageMap.end()) {
		phd -> pagePtr = it_pageMap -> second;
	}

	//If this page is in the disk and we need to put it in the buffer
	else {
		//New one page with null buffer address
		MyDB_PageBase* newPage = new MyDB_PageBase (nullptr, false, -1, false, 0, curId, this);
		// Update pageMap
		pageMap.insert(map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>::value_type(curId, newPage));
		phd -> pagePtr = newPage;
	}

	//Update the handleCount of this page and add this new handle's buffer information
	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;
	return phd;

}